

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O1

SplitNDLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_splitnd(NeuralNetworkLayer *this)

{
  SplitNDLayerParams *this_00;
  
  if (this->_oneof_case_[0] != 0x3cf) {
    clear_layer(this);
    this->_oneof_case_[0] = 0x3cf;
    this_00 = (SplitNDLayerParams *)operator_new(0x40);
    SplitNDLayerParams::SplitNDLayerParams(this_00);
    (this->layer_).splitnd_ = this_00;
  }
  return (SplitNDLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::SplitNDLayerParams* NeuralNetworkLayer::mutable_splitnd() {
  if (!has_splitnd()) {
    clear_layer();
    set_has_splitnd();
    layer_.splitnd_ = new ::CoreML::Specification::SplitNDLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.splitND)
  return layer_.splitnd_;
}